

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::rehash(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
         *this,uint new_hash_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint32 uVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 *puVar33;
  undefined8 *puVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  raw_node *p;
  raw_node *prVar40;
  undefined1 auVar41 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  if ((this->m_num_valid <= new_hash_size) && ((this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    uVar39 = 0x20;
    if (new_hash_size != 0) {
      elemental_vector::increase_capacity
                (&local_48,new_hash_size,new_hash_size == 1,0x10,
                 vector<crnlib::hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>::raw_node>
                 ::object_mover,false);
      auVar29 = _DAT_001ae0a0;
      auVar28 = _DAT_001ae090;
      auVar27 = _DAT_001ae080;
      auVar26 = _DAT_001ae070;
      auVar25 = _DAT_001ae060;
      auVar24 = _DAT_001ae050;
      auVar23 = _DAT_001ae040;
      if (local_48.m_size != new_hash_size) {
        uVar32 = (ulong)(new_hash_size - local_48.m_size) + 0xfffffffffffffff;
        uVar36 = uVar32 & 0xfffffffffffffff;
        auVar41._8_4_ = (int)uVar36;
        auVar41._0_8_ = uVar36;
        auVar41._12_4_ = (int)(uVar36 >> 0x20);
        puVar33 = (undefined1 *)((long)local_48.m_p + (ulong)local_48.m_size * 0x10 + 0xfc);
        lVar35 = 0;
        do {
          auVar59._8_4_ = (int)lVar35;
          auVar59._0_8_ = lVar35;
          auVar59._12_4_ = (int)((ulong)lVar35 >> 0x20);
          auVar62 = auVar41 ^ auVar29;
          auVar67 = (auVar59 | auVar28) ^ auVar29;
          iVar61 = auVar62._0_4_;
          iVar80 = -(uint)(iVar61 < auVar67._0_4_);
          iVar64 = auVar62._4_4_;
          auVar69._4_4_ = -(uint)(iVar64 < auVar67._4_4_);
          iVar65 = auVar62._8_4_;
          iVar84 = -(uint)(iVar65 < auVar67._8_4_);
          iVar66 = auVar62._12_4_;
          auVar69._12_4_ = -(uint)(iVar66 < auVar67._12_4_);
          auVar42._4_4_ = iVar80;
          auVar42._0_4_ = iVar80;
          auVar42._8_4_ = iVar84;
          auVar42._12_4_ = iVar84;
          auVar42 = pshuflw(in_XMM1,auVar42,0xe8);
          auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar64);
          auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar66);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar51 = pshuflw(in_XMM2,auVar68,0xe8);
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar67 = pshuflw(auVar42,auVar69,0xe8);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = (auVar67 | auVar51 & auVar42) ^ auVar62;
          auVar62 = packssdw(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar33[-0xf0] = 0;
          }
          auVar51._4_4_ = iVar80;
          auVar51._0_4_ = iVar80;
          auVar51._8_4_ = iVar84;
          auVar51._12_4_ = iVar84;
          auVar69 = auVar68 & auVar51 | auVar69;
          auVar62 = packssdw(auVar69,auVar69);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar67,auVar62 ^ auVar67);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._0_4_ >> 8 & 1) != 0) {
            puVar33[-0xe0] = 0;
          }
          auVar62 = (auVar59 | auVar27) ^ auVar29;
          auVar52._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar52._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar52._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar52._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar70._4_4_ = auVar52._0_4_;
          auVar70._0_4_ = auVar52._0_4_;
          auVar70._8_4_ = auVar52._8_4_;
          auVar70._12_4_ = auVar52._8_4_;
          iVar80 = -(uint)(auVar62._4_4_ == iVar64);
          iVar84 = -(uint)(auVar62._12_4_ == iVar66);
          auVar10._4_4_ = iVar80;
          auVar10._0_4_ = iVar80;
          auVar10._8_4_ = iVar84;
          auVar10._12_4_ = iVar84;
          auVar81._4_4_ = auVar52._4_4_;
          auVar81._0_4_ = auVar52._4_4_;
          auVar81._8_4_ = auVar52._12_4_;
          auVar81._12_4_ = auVar52._12_4_;
          auVar62 = auVar10 & auVar70 | auVar81;
          auVar62 = packssdw(auVar62,auVar62);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar1,auVar62 ^ auVar1);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
            puVar33[-0xd0] = 0;
          }
          auVar62 = pshufhw(auVar62,auVar70,0x84);
          auVar11._4_4_ = iVar80;
          auVar11._0_4_ = iVar80;
          auVar11._8_4_ = iVar84;
          auVar11._12_4_ = iVar84;
          auVar67 = pshufhw(auVar52,auVar11,0x84);
          auVar42 = pshufhw(auVar62,auVar81,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar42 | auVar67 & auVar62) ^ auVar43;
          auVar62 = packssdw(auVar43,auVar43);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
            puVar33[-0xc0] = 0;
          }
          auVar62 = (auVar59 | auVar26) ^ auVar29;
          auVar53._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar53._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar53._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar53._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar12._4_4_ = auVar53._0_4_;
          auVar12._0_4_ = auVar53._0_4_;
          auVar12._8_4_ = auVar53._8_4_;
          auVar12._12_4_ = auVar53._8_4_;
          auVar67 = pshuflw(auVar81,auVar12,0xe8);
          auVar44._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
          auVar44._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
          auVar44._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
          auVar44._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
          auVar71._4_4_ = auVar44._4_4_;
          auVar71._0_4_ = auVar44._4_4_;
          auVar71._8_4_ = auVar44._12_4_;
          auVar71._12_4_ = auVar44._12_4_;
          auVar62 = pshuflw(auVar44,auVar71,0xe8);
          auVar72._4_4_ = auVar53._4_4_;
          auVar72._0_4_ = auVar53._4_4_;
          auVar72._8_4_ = auVar53._12_4_;
          auVar72._12_4_ = auVar53._12_4_;
          auVar42 = pshuflw(auVar53,auVar72,0xe8);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 & auVar67,(auVar42 | auVar62 & auVar67) ^ auVar2);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar33[-0xb0] = 0;
          }
          auVar13._4_4_ = auVar53._0_4_;
          auVar13._0_4_ = auVar53._0_4_;
          auVar13._8_4_ = auVar53._8_4_;
          auVar13._12_4_ = auVar53._8_4_;
          auVar72 = auVar71 & auVar13 | auVar72;
          auVar42 = packssdw(auVar72,auVar72);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62,auVar42 ^ auVar3);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._4_2_ >> 8 & 1) != 0) {
            puVar33[-0xa0] = 0;
          }
          auVar62 = (auVar59 | auVar25) ^ auVar29;
          auVar54._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar54._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar54._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar54._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar73._4_4_ = auVar54._0_4_;
          auVar73._0_4_ = auVar54._0_4_;
          auVar73._8_4_ = auVar54._8_4_;
          auVar73._12_4_ = auVar54._8_4_;
          iVar80 = -(uint)(auVar62._4_4_ == iVar64);
          iVar84 = -(uint)(auVar62._12_4_ == iVar66);
          auVar14._4_4_ = iVar80;
          auVar14._0_4_ = iVar80;
          auVar14._8_4_ = iVar84;
          auVar14._12_4_ = iVar84;
          auVar82._4_4_ = auVar54._4_4_;
          auVar82._0_4_ = auVar54._4_4_;
          auVar82._8_4_ = auVar54._12_4_;
          auVar82._12_4_ = auVar54._12_4_;
          auVar62 = auVar14 & auVar73 | auVar82;
          auVar62 = packssdw(auVar62,auVar62);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar4,auVar62 ^ auVar4);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar33[-0x90] = 0;
          }
          auVar62 = pshufhw(auVar62,auVar73,0x84);
          auVar15._4_4_ = iVar80;
          auVar15._0_4_ = iVar80;
          auVar15._8_4_ = iVar84;
          auVar15._12_4_ = iVar84;
          auVar67 = pshufhw(auVar54,auVar15,0x84);
          auVar42 = pshufhw(auVar62,auVar82,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar42 | auVar67 & auVar62) ^ auVar45;
          auVar62 = packssdw(auVar45,auVar45);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._6_2_ >> 8 & 1) != 0) {
            puVar33[-0x80] = 0;
          }
          auVar62 = (auVar59 | auVar24) ^ auVar29;
          auVar55._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar55._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar55._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar55._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar16._4_4_ = auVar55._0_4_;
          auVar16._0_4_ = auVar55._0_4_;
          auVar16._8_4_ = auVar55._8_4_;
          auVar16._12_4_ = auVar55._8_4_;
          auVar67 = pshuflw(auVar82,auVar16,0xe8);
          auVar46._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
          auVar46._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
          auVar46._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
          auVar46._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
          auVar74._4_4_ = auVar46._4_4_;
          auVar74._0_4_ = auVar46._4_4_;
          auVar74._8_4_ = auVar46._12_4_;
          auVar74._12_4_ = auVar46._12_4_;
          auVar62 = pshuflw(auVar46,auVar74,0xe8);
          auVar75._4_4_ = auVar55._4_4_;
          auVar75._0_4_ = auVar55._4_4_;
          auVar75._8_4_ = auVar55._12_4_;
          auVar75._12_4_ = auVar55._12_4_;
          auVar42 = pshuflw(auVar55,auVar75,0xe8);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar42 | auVar62 & auVar67) ^ auVar56;
          auVar42 = packssdw(auVar56,auVar56);
          auVar62 = packsswb(auVar62 & auVar67,auVar42);
          if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar33[-0x70] = 0;
          }
          auVar17._4_4_ = auVar55._0_4_;
          auVar17._0_4_ = auVar55._0_4_;
          auVar17._8_4_ = auVar55._8_4_;
          auVar17._12_4_ = auVar55._8_4_;
          auVar75 = auVar74 & auVar17 | auVar75;
          auVar42 = packssdw(auVar75,auVar75);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar5,auVar42 ^ auVar5);
          auVar62 = packsswb(auVar62,auVar42);
          if ((auVar62._8_2_ >> 8 & 1) != 0) {
            puVar33[-0x60] = 0;
          }
          auVar62 = (auVar59 | auVar23) ^ auVar29;
          auVar57._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar57._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar57._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar57._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar76._4_4_ = auVar57._0_4_;
          auVar76._0_4_ = auVar57._0_4_;
          auVar76._8_4_ = auVar57._8_4_;
          auVar76._12_4_ = auVar57._8_4_;
          iVar80 = -(uint)(auVar62._4_4_ == iVar64);
          iVar84 = -(uint)(auVar62._12_4_ == iVar66);
          auVar18._4_4_ = iVar80;
          auVar18._0_4_ = iVar80;
          auVar18._8_4_ = iVar84;
          auVar18._12_4_ = iVar84;
          auVar83._4_4_ = auVar57._4_4_;
          auVar83._0_4_ = auVar57._4_4_;
          auVar83._8_4_ = auVar57._12_4_;
          auVar83._12_4_ = auVar57._12_4_;
          auVar62 = auVar18 & auVar76 | auVar83;
          auVar62 = packssdw(auVar62,auVar62);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar33[-0x50] = 0;
          }
          auVar62 = pshufhw(auVar62,auVar76,0x84);
          auVar19._4_4_ = iVar80;
          auVar19._0_4_ = iVar80;
          auVar19._8_4_ = iVar84;
          auVar19._12_4_ = iVar84;
          auVar67 = pshufhw(auVar57,auVar19,0x84);
          auVar42 = pshufhw(auVar62,auVar83,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar42 | auVar67 & auVar62) ^ auVar47;
          auVar62 = packssdw(auVar47,auVar47);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._10_2_ >> 8 & 1) != 0) {
            puVar33[-0x40] = 0;
          }
          auVar62 = (auVar59 | _DAT_001ae030) ^ auVar29;
          auVar58._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar58._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar58._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar58._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar20._4_4_ = auVar58._0_4_;
          auVar20._0_4_ = auVar58._0_4_;
          auVar20._8_4_ = auVar58._8_4_;
          auVar20._12_4_ = auVar58._8_4_;
          auVar67 = pshuflw(auVar83,auVar20,0xe8);
          auVar48._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
          auVar48._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
          auVar48._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
          auVar48._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
          auVar77._4_4_ = auVar48._4_4_;
          auVar77._0_4_ = auVar48._4_4_;
          auVar77._8_4_ = auVar48._12_4_;
          auVar77._12_4_ = auVar48._12_4_;
          auVar62 = pshuflw(auVar48,auVar77,0xe8);
          auVar78._4_4_ = auVar58._4_4_;
          auVar78._0_4_ = auVar58._4_4_;
          auVar78._8_4_ = auVar58._12_4_;
          auVar78._12_4_ = auVar58._12_4_;
          auVar42 = pshuflw(auVar58,auVar78,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 & auVar67,(auVar42 | auVar62 & auVar67) ^ auVar7);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar33[-0x30] = 0;
          }
          auVar21._4_4_ = auVar58._0_4_;
          auVar21._0_4_ = auVar58._0_4_;
          auVar21._8_4_ = auVar58._8_4_;
          auVar21._12_4_ = auVar58._8_4_;
          auVar78 = auVar77 & auVar21 | auVar78;
          auVar42 = packssdw(auVar78,auVar78);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62,auVar42 ^ auVar8);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62._12_2_ >> 8 & 1) != 0) {
            puVar33[-0x20] = 0;
          }
          auVar62 = (auVar59 | _DAT_001ae020) ^ auVar29;
          auVar49._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
          auVar49._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
          auVar49._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
          auVar49._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
          auVar79._4_4_ = auVar49._0_4_;
          auVar79._0_4_ = auVar49._0_4_;
          auVar79._8_4_ = auVar49._8_4_;
          auVar79._12_4_ = auVar49._8_4_;
          auVar60._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
          auVar60._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar63._4_4_ = auVar49._4_4_;
          auVar63._0_4_ = auVar49._4_4_;
          auVar63._8_4_ = auVar49._12_4_;
          auVar63._12_4_ = auVar49._12_4_;
          auVar42 = auVar60 & auVar79 | auVar63;
          auVar62 = packssdw(auVar49,auVar42);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar62 = packssdw(auVar62 ^ auVar9,auVar62 ^ auVar9);
          auVar62 = packsswb(auVar62,auVar62);
          if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar33[-0x10] = 0;
          }
          auVar62 = pshufhw(auVar62,auVar79,0x84);
          in_XMM2 = pshufhw(auVar42,auVar60,0x84);
          in_XMM2 = in_XMM2 & auVar62;
          auVar62 = pshufhw(auVar62,auVar63,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar62 | in_XMM2) ^ auVar50;
          auVar62 = packssdw(auVar50,auVar50);
          in_XMM1 = packsswb(auVar62,auVar62);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar33 = 0;
          }
          lVar35 = lVar35 + 0x10;
          puVar33 = puVar33 + 0x100;
        } while ((uVar36 - ((uint)uVar32 & 0xf)) + 0x10 != lVar35);
      }
      local_48.m_size = new_hash_size;
      if (new_hash_size != 1) {
        uVar39 = 0x20;
        uVar32 = (ulong)new_hash_size;
        do {
          uVar39 = uVar39 - 1;
          uVar31 = (uint)uVar32;
          uVar32 = uVar32 >> 1;
        } while (3 < uVar31);
      }
    }
    local_30._4_4_ = 0xffffffff;
    p = (this->m_values).m_p;
    uVar32 = (ulong)(this->m_values).m_size;
    local_38 = uVar39;
    if (uVar32 != 0) {
      prVar40 = p + uVar32;
      do {
        if (p->m_bits[0xc] != '\0') {
          uVar30 = fast_hash(p,8);
          uVar31 = uVar30 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          puVar34 = (undefined8 *)((long)local_48.m_p + (ulong)uVar31 * 0x10);
          if (*(char *)((long)local_48.m_p + (ulong)uVar31 * 0x10 + 0xc) != '\0') {
            uVar38 = uVar31;
            do {
              uVar37 = uVar38 - 1;
              if (uVar38 == 0) {
                uVar37 = local_48.m_size - 1;
              }
              if (uVar37 == uVar31) goto LAB_0018f963;
              puVar34 = puVar34 + -2;
              if (uVar38 == 0) {
                puVar34 = (undefined8 *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x10);
              }
              uVar38 = uVar37;
            } while (*(char *)((long)puVar34 + 0xc) != '\0');
          }
          uVar22 = *(undefined8 *)(p->m_bits + 8);
          *puVar34 = *(undefined8 *)p->m_bits;
          puVar34[1] = uVar22;
          p->m_bits[0xc] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_0018f963:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        p = p + 1;
      } while (p != prVar40);
      p = (this->m_values).m_p;
    }
    local_30._4_4_ = new_hash_size + 1 >> 1;
    if (p != (raw_node *)0x0) {
      crnlib_free(p);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    (this->m_values).m_size = local_48.m_size;
    (this->m_values).m_capacity = local_48.m_capacity;
    this->m_hash_shift = local_38;
    this->m_num_valid = (uint)local_30;
    this->m_grow_threshold = local_30._4_4_;
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }